

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall
Jinx::Impl::Parser::ParsePropertyDeclaration(Parser *this,VisibilityType scope,bool readOnly)

{
  initializer_list<Jinx::Impl::SymbolType> symbols;
  byte bVar1;
  VisibilityType visibility;
  bool bVar2;
  pointer pSVar3;
  reference __str;
  element_type *name_00;
  element_type *peVar4;
  String *pSVar5;
  RuntimeID id;
  mapped_type *this_00;
  RuntimeID local_170;
  Variant local_168;
  undefined1 local_140 [8];
  PropertyName propertyName;
  undefined1 local_c8 [8];
  String name;
  String libraryName;
  LibraryIPtr propertyLibrary;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> libName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range2;
  byte local_15;
  VisibilityType local_14;
  bool readOnly_local;
  Parser *pPStack_10;
  VisibilityType scope_local;
  Parser *this_local;
  
  if ((this->m_error & 1U) == 0) {
    local_15 = readOnly;
    local_14 = scope;
    pPStack_10 = this;
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                *)std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                            (this->m_symbolList);
    bVar2 = __gnu_cxx::operator==
                      (&this->m_currentSymbol,
                       (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)&__range2);
    if (bVar2) {
      Error<>(this,"Unexpected end of script when parsing property declaration");
    }
    else {
      pSVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      if (pSVar3->type == NameValue) {
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ::begin(&this->m_importList);
        libName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ::end(&this->m_importList);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                                           *)((long)&libName.field_2 + 8)), bVar2) {
          __str = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                  ::operator*(&__end2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_58,__str);
          pSVar3 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&this->m_currentSymbol);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                   *)local_58,&pSVar3->text);
          if (bVar2) {
            Error<>(this,"Property name cannot start with an import library name");
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                        local_58);
          if (bVar2) {
            return;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
          ::operator++(&__end2);
        }
        std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                  ((shared_ptr<Jinx::Impl::Library> *)((long)&libraryName.field_2 + 8),
                   &this->m_library);
        CheckLibraryName_abi_cxx11_((String *)&stack0xffffffffffffff68,this);
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      &stack0xffffffffffffff68);
        if (!bVar2) {
          name_00 = std::
                    __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_runtime);
          Runtime::GetLibraryInternal((Runtime *)((long)&name.field_2 + 8),(String *)name_00);
          std::shared_ptr<Jinx::Impl::Library>::operator=
                    ((shared_ptr<Jinx::Impl::Library> *)((long)&libraryName.field_2 + 8),
                     (shared_ptr<Jinx::Impl::Library> *)((long)&name.field_2 + 8));
          std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                    ((shared_ptr<Jinx::Impl::Library> *)((long)&name.field_2 + 8));
          NextSymbol(this);
        }
        bVar2 = CheckName(this);
        if (bVar2) {
          propertyName.m_partCount._4_4_ = 0x3f;
          symbols._M_len = 1;
          symbols._M_array = (iterator)((long)&propertyName.m_partCount + 4);
          ParseMultiName_abi_cxx11_((String *)local_c8,this,symbols);
          peVar4 = std::
                   __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(libraryName.field_2._M_local_buf + 8));
          bVar2 = Library::PropertyNameExists(peVar4,(String *)local_c8);
          visibility = local_14;
          bVar1 = local_15;
          if (bVar2) {
            PreviousSymbol(this);
            Error<>(this,"Property is already defined");
          }
          else {
            peVar4 = std::
                     __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(libraryName.field_2._M_local_buf + 8));
            pSVar5 = Library::GetName_abi_cxx11_(peVar4);
            Variant::Variant(&local_168,(nullptr_t)0x0);
            PropertyName::PropertyName
                      ((PropertyName *)local_140,visibility,(bool)(bVar1 & 1),pSVar5,
                       (String *)local_c8,&local_168);
            Variant::~Variant(&local_168);
            peVar4 = std::
                     __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(libraryName.field_2._M_local_buf + 8));
            bVar2 = Library::RegisterPropertyName(peVar4,(PropertyName *)local_140,true);
            if (bVar2) {
              EmitOpcode(this,Property);
              PropertyName::Write((PropertyName *)local_140,&this->m_writer);
              bVar2 = Accept(this,To);
              if (bVar2) {
                ParseExpression(this);
                Expect(this,NewLine,"Error parsing expression");
                EmitOpcode(this,SetProp);
                id = PropertyName::GetId((PropertyName *)local_140);
                EmitId(this,id);
                pSVar5 = PropertyName::GetName_abi_cxx11_((PropertyName *)local_140);
                local_170 = PropertyName::GetId((PropertyName *)local_140);
                this_00 = std::
                          map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                          ::operator[](&this->m_idNameMap,&local_170);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                operator=(this_00,pSVar5);
              }
              else if ((local_15 & 1) == 0) {
                Expect(this,NewLine,"Error declaring property");
              }
              else {
                Error<>(this,"Must assign property an initial value");
              }
            }
            else {
              Error<>(this,"Error registering property name.  Possible duplicate.");
            }
            PropertyName::~PropertyName((PropertyName *)local_140);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                        local_c8);
        }
        else {
          Error<>(this,"Property name expected");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      &stack0xffffffffffffff68);
        std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                  ((shared_ptr<Jinx::Impl::Library> *)((long)&libraryName.field_2 + 8));
      }
      else {
        Error<>(this,"Unexpected symbol type when parsing property declaration");
      }
    }
  }
  return;
}

Assistant:

inline_t void Parser::ParsePropertyDeclaration(VisibilityType scope, bool readOnly)
	{
		if (m_error)
			return;

		if (m_currentSymbol == m_symbolList.end())
		{
			Error("Unexpected end of script when parsing property declaration");
			return;
		}
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing property declaration");
			return;
		}

		// Check if first keyword matches a library name
		for (auto libName : m_importList)
		{
			if (libName == m_currentSymbol->text)
			{
				Error("Property name cannot start with an import library name");
				return;
			}
		}

		// Find out which library this property belongs to
		auto propertyLibrary = m_library;
		auto libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			propertyLibrary = m_runtime->GetLibraryInternal(libraryName);
			NextSymbol();
		}

		// Parse the property name
		if (!CheckName())
		{
			Error("Property name expected");
			return;
		}

		// Search for multi-part property names
		String name = ParseMultiName({ SymbolType::To });

		if (propertyLibrary->PropertyNameExists(name))
		{
			PreviousSymbol();
			Error("Property is already defined");
			return;
		}

		// Create a PropertyName object for registration
		PropertyName propertyName(scope, readOnly, propertyLibrary->GetName(), name);

		// Register the property name, and check for duplicates
		if (!propertyLibrary->RegisterPropertyName(propertyName, true))
		{
			Error("Error registering property name.  Possible duplicate.");
			return;
		}

		// Set property value
		EmitOpcode(Opcode::Property);
		propertyName.Write(m_writer);

		if (Accept(SymbolType::To))
		{
			// Parse expression
			ParseExpression();
			Expect(SymbolType::NewLine, "Error parsing expression");

			// Set property opcode
			EmitOpcode(Opcode::SetProp);
			EmitId(propertyName.GetId());
			m_idNameMap[propertyName.GetId()] = propertyName.GetName();
		}
		else if (readOnly)
		{
			// A declaration with no assignment is allowed, but not for a readonly property			
			Error("Must assign property an initial value");
			return;
		}
		else
		{
			Expect(SymbolType::NewLine, "Error declaring property");
		}
	}